

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundingBoxHelpers.cpp
# Opt level: O0

bool __thiscall
iDynTree::BoundingBoxProjectionConstraint::buildBoundingBox
          (BoundingBoxProjectionConstraint *this,Direction *xAxisOfPlaneInWorld,
          Direction *yAxisOfPlaneInWorld,Position *originOfPlaneInWorld,
          vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
          *supportPolygonsExpressedInSupportFrame,
          vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>
          *absoluteFrame_X_supportFrame)

{
  double dVar1;
  BoundingBoxProjectionConstraint *pBVar2;
  ulong uVar3;
  bool bVar4;
  size_type sVar5;
  reference pVVar6;
  reference pdVar7;
  double *pdVar8;
  vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> *pvVar9;
  reference pvVar10;
  Position *in_RCX;
  long in_RDI;
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> *in_R8;
  vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *in_R9;
  Vector2 VVar11;
  Vector2 vec4;
  Vector2 vec3;
  Vector2 vec2;
  Vector2 vec1;
  double maxY;
  double minY;
  double maxX;
  double minX;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  minMaxYCoord;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  minMaxXCoord;
  VectorFixSize<2U> point;
  iterator __end1;
  iterator __begin1;
  vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> *__range1;
  vector<double,_std::allocator<double>_> yCoords;
  vector<double,_std::allocator<double>_> xCoords;
  Vector2 newProjectedPoint;
  size_t vertex;
  size_t poly;
  vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> projectedPoints
  ;
  size_t i;
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
  supportPolygonsExpressedInAbsoluteFrame;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffc08;
  Block<Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_false>
  *in_stack_fffffffffffffc10;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffc18;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffc20;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffc28;
  pointer pVVar12;
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> *in_stack_fffffffffffffc30;
  Transform *in_stack_fffffffffffffc70;
  Polygon *in_stack_fffffffffffffc78;
  double dVar13;
  Position *in_stack_fffffffffffffca8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *this_00;
  BoundingBoxProjectionConstraint *in_stack_fffffffffffffcb0;
  BoundingBoxProjectionConstraint *in_stack_fffffffffffffd10;
  VectorFixSize<2U> local_268;
  VectorFixSize<2U> local_258;
  VectorFixSize<2U> local_248;
  VectorFixSize<2U> local_238;
  double local_228;
  pointer local_220;
  double local_218;
  double local_210;
  double *local_208;
  double *local_200;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  local_1f8;
  double *local_1e8;
  double *local_1e0;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  local_1d8;
  VectorFixSize<2U> local_1c8;
  VectorFixSize<2U> *local_1b8;
  __normal_iterator<iDynTree::VectorFixSize<2U>_*,_std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>_>
  local_1b0;
  vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> *local_1a8;
  undefined4 local_16c;
  double local_168;
  double local_160;
  BoundingBoxProjectionConstraint *local_158;
  ulong local_150;
  vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> local_148 [2];
  ulong local_118;
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> local_100 [8];
  vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *local_38;
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> *local_30;
  byte local_1;
  
  local_38 = in_R9;
  local_30 = in_R8;
  iDynTree::Position::operator=((Position *)(in_RDI + 0xf0),in_RCX);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc28);
  toEigen<2u,3u>((MatrixFixSize<2U,_3U> *)in_stack_fffffffffffffc28);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>>::block<1,3>
            (in_stack_fffffffffffffc28,(Index)in_stack_fffffffffffffc20._M_current,
             (Index)in_stack_fffffffffffffc18._M_current);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>,1,3,false>::
  operator=(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc28);
  toEigen<2u,3u>((MatrixFixSize<2U,_3U> *)in_stack_fffffffffffffc28);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>>::block<1,3>
            (in_stack_fffffffffffffc28,(Index)in_stack_fffffffffffffc20._M_current,
             (Index)in_stack_fffffffffffffc18._M_current);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>,1,3,false>::
  operator=(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::vector
            ((vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> *)0x167b2b);
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::size(local_30);
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::resize
            (in_stack_fffffffffffffc30,(size_type)in_stack_fffffffffffffc28);
  local_118 = 0;
  while( true ) {
    uVar3 = local_118;
    sVar5 = std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::size(local_30);
    if (sVar5 <= uVar3) break;
    std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::operator[]
              (local_30,local_118);
    std::vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>::operator[]
              (local_38,local_118);
    Polygon::applyTransform(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::operator[]
              (local_100,local_118);
    Polygon::operator=((Polygon *)in_stack_fffffffffffffc10,(Polygon *)in_stack_fffffffffffffc08);
    Polygon::~Polygon((Polygon *)0x167c05);
    local_118 = local_118 + 1;
  }
  std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::vector
            ((vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> *)
             0x167c44);
  local_150 = 0;
  while( true ) {
    uVar3 = local_150;
    sVar5 = std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::size(local_100);
    if (sVar5 <= uVar3) break;
    local_158 = (BoundingBoxProjectionConstraint *)0x0;
    while( true ) {
      pBVar2 = local_158;
      std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::operator[]
                (local_100,local_150);
      in_stack_fffffffffffffd10 =
           (BoundingBoxProjectionConstraint *)Polygon::getNrOfVertices((Polygon *)0x167cba);
      if (in_stack_fffffffffffffd10 <= pBVar2) break;
      std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::operator[]
                (local_100,local_150);
      Polygon::operator()((Polygon *)in_stack_fffffffffffffc10,(size_t)in_stack_fffffffffffffc08);
      VVar11 = project(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      local_160 = VVar11.m_data[1];
      local_168 = VVar11.m_data[0];
      std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
      push_back((vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                 *)in_stack_fffffffffffffc20._M_current,
                (value_type *)in_stack_fffffffffffffc18._M_current);
      local_158 = (BoundingBoxProjectionConstraint *)&local_158->field_0x1;
    }
    local_150 = local_150 + 1;
  }
  sVar5 = std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
          size(local_148);
  if (sVar5 < 3) {
    local_1 = 0;
    local_16c = 1;
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x167df7);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x167e04);
    local_1a8 = local_148;
    local_1b0._M_current =
         (VectorFixSize<2U> *)
         std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
         begin((vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> *
               )in_stack_fffffffffffffc08);
    local_1b8 = (VectorFixSize<2U> *)
                std::
                vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
                end((vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                     *)in_stack_fffffffffffffc08);
    while( true ) {
      bVar4 = __gnu_cxx::operator!=
                        ((__normal_iterator<iDynTree::VectorFixSize<2U>_*,_std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>_>
                          *)in_stack_fffffffffffffc10,
                         (__normal_iterator<iDynTree::VectorFixSize<2U>_*,_std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>_>
                          *)in_stack_fffffffffffffc08);
      if (!bVar4) break;
      pVVar6 = __gnu_cxx::
               __normal_iterator<iDynTree::VectorFixSize<2U>_*,_std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>_>
               ::operator*(&local_1b0);
      local_1c8.m_data[0] = pVVar6->m_data[0];
      local_1c8.m_data[1] = pVVar6->m_data[1];
      VectorFixSize<2U>::operator()(&local_1c8,0);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc20._M_current,
                 in_stack_fffffffffffffc18._M_current);
      VectorFixSize<2U>::operator()(&local_1c8,1);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc20._M_current,
                 in_stack_fffffffffffffc18._M_current);
      __gnu_cxx::
      __normal_iterator<iDynTree::VectorFixSize<2U>_*,_std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>_>
      ::operator++(&local_1b0);
    }
    local_1e0 = (double *)
                std::vector<double,_std::allocator<double>_>::begin
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc08);
    local_1e8 = (double *)
                std::vector<double,_std::allocator<double>_>::end
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc08);
    local_1d8 = std::
                minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                          (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    local_200 = (double *)
                std::vector<double,_std::allocator<double>_>::begin
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc08);
    local_208 = (double *)
                std::vector<double,_std::allocator<double>_>::end
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc08);
    local_1f8 = std::
                minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                          (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    this_00 = &local_1f8.second;
    pdVar7 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_1d8.first);
    local_210 = *pdVar7;
    pdVar7 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_1d8.second);
    local_218 = *pdVar7;
    pdVar7 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_1f8.first);
    local_220 = (pointer)*pdVar7;
    pdVar7 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(this_00);
    local_228 = *pdVar7;
    VectorFixSize<2U>::VectorFixSize(&local_238);
    VectorFixSize<2U>::VectorFixSize(&local_248);
    VectorFixSize<2U>::VectorFixSize(&local_258);
    VectorFixSize<2U>::VectorFixSize(&local_268);
    dVar13 = local_210;
    pdVar8 = VectorFixSize<2U>::operator()(&local_238,0);
    dVar1 = local_228;
    *pdVar8 = dVar13;
    pdVar8 = VectorFixSize<2U>::operator()(&local_238,1);
    *pdVar8 = dVar1;
    dVar13 = local_218;
    pdVar8 = VectorFixSize<2U>::operator()(&local_248,0);
    dVar1 = local_228;
    *pdVar8 = dVar13;
    pdVar8 = VectorFixSize<2U>::operator()(&local_248,1);
    dVar13 = local_218;
    *pdVar8 = dVar1;
    pdVar8 = VectorFixSize<2U>::operator()(&local_258,0);
    pVVar12 = local_220;
    *pdVar8 = dVar13;
    pdVar8 = VectorFixSize<2U>::operator()(&local_258,1);
    dVar1 = local_210;
    *pdVar8 = (double)pVVar12;
    pdVar8 = VectorFixSize<2U>::operator()(&local_268,0);
    *pdVar8 = dVar1;
    pVVar12 = local_220;
    pvVar9 = (vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> *)
             VectorFixSize<2U>::operator()(&local_268,1);
    (pvVar9->
    super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>).
    _M_impl.super__Vector_impl_data._M_start = pVVar12;
    std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::resize
              (pvVar9,(size_type)pVVar12);
    in_stack_fffffffffffffc20._M_current =
         std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::at
                   ((vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                     *)in_stack_fffffffffffffc10,(size_type)in_stack_fffffffffffffc08)->m_data;
    (((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc20._M_current)->
    super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_238.m_data[0];
    (((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc20._M_current)->
    super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_238.m_data[1];
    pvVar10 = std::
              vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::at
                        ((vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                          *)in_stack_fffffffffffffc10,(size_type)in_stack_fffffffffffffc08);
    pvVar10->m_data[0] = local_268.m_data[0];
    pvVar10->m_data[1] = local_268.m_data[1];
    pvVar9 = (vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> *)
             std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
             ::at((vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                   *)in_stack_fffffffffffffc10,(size_type)in_stack_fffffffffffffc08);
    (pvVar9->
    super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_258.m_data[0];
    (pvVar9->
    super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_258.m_data[1];
    pvVar10 = std::
              vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::at
                        (pvVar9,(size_type)in_stack_fffffffffffffc08);
    pvVar10->m_data[0] = local_248.m_data[0];
    pvVar10->m_data[1] = local_248.m_data[1];
    buildConstraintMatrix(in_stack_fffffffffffffd10);
    local_1 = 0;
    local_16c = 1;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc20._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc20._M_current);
  }
  std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::~vector
            ((vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> *)
             in_stack_fffffffffffffc20._M_current);
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::~vector
            ((vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> *)
             in_stack_fffffffffffffc20._M_current);
  return (bool)(local_1 & 1);
}

Assistant:

bool BoundingBoxProjectionConstraint::buildBoundingBox(const iDynTree::Direction xAxisOfPlaneInWorld,
                                                         const iDynTree::Direction yAxisOfPlaneInWorld,
                                                         const iDynTree::Position originOfPlaneInWorld,
                                                         const std::vector<Polygon> &supportPolygonsExpressedInSupportFrame,
                                                         const std::vector<Transform> &absoluteFrame_X_supportFrame)
    {
      o = originOfPlaneInWorld;
      toEigen(P).block<1, 3>(0,0) = toEigen(xAxisOfPlaneInWorld);
      toEigen(P).block<1, 3>(1,0) = toEigen(yAxisOfPlaneInWorld);

      // Transform the polygons in the absolute frame
      std::vector<Polygon> supportPolygonsExpressedInAbsoluteFrame;

      supportPolygonsExpressedInAbsoluteFrame.resize(supportPolygonsExpressedInSupportFrame.size());

      for(size_t i=0; i< supportPolygonsExpressedInSupportFrame.size(); i++)
      {
          supportPolygonsExpressedInAbsoluteFrame[i] = supportPolygonsExpressedInSupportFrame[i].applyTransform(absoluteFrame_X_supportFrame[i]);
      }

      // Project the polygons on the projection plane
      std::vector<Vector2> projectedPoints;

      for(size_t poly=0; poly < supportPolygonsExpressedInAbsoluteFrame.size(); poly++)
      {
          for(size_t vertex=0; vertex < supportPolygonsExpressedInAbsoluteFrame[poly].getNrOfVertices(); vertex++)
          {
               Vector2 newProjectedPoint = project(supportPolygonsExpressedInAbsoluteFrame[poly](vertex));
               //toEigen(newProjectedPoint) = toEigen(P)*toEigen(supportPolygonsExpressedInAbsoluteFrame[poly](vertex)-o);
               projectedPoints.push_back(newProjectedPoint);
          }
      }

      if (projectedPoints.size() <= 2)
      {
          return false;
      }

      // Compute the bounding box
      //  Build a vector from projectedPoints with the x coordinates
      std::vector<double> xCoords;
      std::vector<double> yCoords;
      for (auto point : projectedPoints) {
          xCoords.push_back(point(0));
          yCoords.push_back(point(1));
      }

      // Find min and max x coordinate
      auto minMaxXCoord = std::minmax_element(xCoords.begin(), xCoords.end());
      auto minMaxYCoord = std::minmax_element(yCoords.begin(), yCoords.end());
      double minX, maxX, minY, maxY;
      minX = *minMaxXCoord.first;
      maxX = *minMaxXCoord.second;
      minY = *minMaxYCoord.first;
      maxY = *minMaxYCoord.second;

      // Compute bounding box
      Vector2 vec1, vec2, vec3, vec4;
      vec1(0) = minX; vec1(1) = maxY;
      vec2(0) = maxX; vec2(1) = maxY;
      vec3(0) = maxX; vec3(1) = minY;
      vec4(0) = minX; vec4(1) = minY;

      projectedBoundingBox.m_vertices.resize(4);
      projectedBoundingBox.m_vertices.at(0) = vec1;
      projectedBoundingBox.m_vertices.at(1) = vec4;
      projectedBoundingBox.m_vertices.at(2) = vec3;
      projectedBoundingBox.m_vertices.at(3) = vec2;

      // Build the constraint matrix
      buildConstraintMatrix();
      return false;

      // Update AtimesP matrix
      AtimesP.resize(A.rows(),P.cols());

      toEigen(AtimesP) = toEigen(A)*toEigen(P);

      return true;
    }